

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

int __thiscall Assimp::B3DImporter::ReadByte(B3DImporter *this)

{
  uint uVar1;
  pointer puVar2;
  B3DImporter *this_00;
  undefined1 local_30 [32];
  
  uVar1 = this->_pos;
  puVar2 = (this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar1 <
      (ulong)((long)(this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
    this->_pos = uVar1 + 1;
    return (int)puVar2[uVar1];
  }
  local_30._0_8_ = local_30 + 0x10;
  this_00 = (B3DImporter *)local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"EOF","");
  Fail(this_00,(string *)local_30);
}

Assistant:

int B3DImporter::ReadByte(){
    if( _pos<_buf.size() ) return _buf[_pos++];
    Fail( "EOF" );
    return 0;
}